

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TPZSpStructMatrix.cpp
# Opt level: O0

int __thiscall
TPZSpStructMatrix<std::complex<double>,_TPZStructMatrixOT<std::complex<double>_>_>::ClassId
          (TPZSpStructMatrix<std::complex<double>,_TPZStructMatrixOT<std::complex<double>_>_> *this)

{
  uint uVar1;
  int iVar2;
  int iVar3;
  string *in_stack_ffffffffffffffc0;
  allocator<char> *in_stack_ffffffffffffffd0;
  char *in_stack_ffffffffffffffd8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffffe0;
  TPZStructMatrixOT<std::complex<double>_> *in_stack_fffffffffffffff0;
  
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_ffffffffffffffe0,in_stack_ffffffffffffffd8,in_stack_ffffffffffffffd0);
  uVar1 = Hash(in_stack_ffffffffffffffc0);
  iVar2 = TPZStructMatrixT<std::complex<double>_>::ClassId
                    ((TPZStructMatrixT<std::complex<double>_> *)in_stack_fffffffffffffff0);
  iVar3 = TPZStructMatrixOT<std::complex<double>_>::ClassId(in_stack_fffffffffffffff0);
  std::__cxx11::string::~string((string *)&stack0xffffffffffffffd8);
  std::allocator<char>::~allocator((allocator<char> *)&stack0xffffffffffffffd7);
  return uVar1 ^ iVar2 * 2 ^ iVar3 << 2;
}

Assistant:

int TPZSpStructMatrix<TVar,TPar>::ClassId() const{
    return Hash("TPZSpStructMatrix") ^
        TPZStructMatrixT<TVar>::ClassId() << 1 ^
        TPar::ClassId() << 2;
}